

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  size_t _elemsize;
  long *plVar12;
  _func_int **pp_Var13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined1 uVar28;
  undefined8 uVar29;
  undefined8 uVar36;
  undefined8 uVar43;
  long lVar50;
  _func_int *p_Var51;
  long lVar52;
  void *pvVar53;
  void *pvVar54;
  int g;
  uint uVar55;
  int iVar56;
  long lVar57;
  int remain_1;
  uint uVar58;
  int iVar59;
  float *pfVar60;
  void *pvVar61;
  void *pvVar62;
  long lVar63;
  long lVar64;
  Layer *pLVar65;
  int remain_2;
  int remain_4;
  int remain;
  int iVar66;
  long lVar67;
  int iVar68;
  void *pvVar69;
  ulong uVar70;
  void *pvVar71;
  ulong uVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  int local_288;
  Mat bottom_blob_int8_g;
  Mat bottom_blob_g;
  _Vector_base<float,_std::allocator<float>_> *local_1c0;
  Mat bottom_blob_int8;
  Option opt_g;
  Option opt_g_1;
  Mat bottom_blob_unbordered;
  _Vector_base<float,_std::allocator<float>_> local_90;
  _Vector_base<float,_std::allocator<float>_> local_78 [3];
  undefined3 uVar25;
  undefined2 uVar27;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined3 uVar32;
  undefined1 uVar33;
  undefined2 uVar34;
  undefined1 uVar35;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined3 uVar39;
  undefined1 uVar40;
  undefined2 uVar41;
  undefined1 uVar42;
  undefined1 uVar44;
  undefined1 uVar45;
  undefined3 uVar46;
  undefined1 uVar47;
  undefined2 uVar48;
  undefined1 uVar49;
  
  iVar9 = bottom_blob->c;
  p_Var51 = this->_vptr_ConvolutionDepthWise_x86[-3];
  if (iVar9 % *(int *)(&this->field_0xb8 + (long)p_Var51) != 0) {
    return -100;
  }
  if (*(int *)(&this->field_0x80 + (long)p_Var51) % *(int *)(&this->field_0xb8 + (long)p_Var51) != 0
     ) {
    return -100;
  }
  iVar56 = bottom_blob->w;
  iVar59 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  uVar55 = (*(int *)(&this->field_0x84 + (long)p_Var51) + -1) *
           *(int *)(&this->field_0x8c + (long)p_Var51);
  uVar58 = (*(int *)(&this->field_0x88 + (long)p_Var51) + -1) *
           *(int *)(&this->field_0x90 + (long)p_Var51);
  Mat::Mat(&bottom_blob_unbordered,bottom_blob);
  if ((_elemsize != 1 & (&this->field_0x20c)[(long)this->_vptr_ConvolutionDepthWise_x86[-3]]) == 1)
  {
    bottom_blob_int8.elemsize._0_4_ = 0;
    bottom_blob_int8.elemsize._4_4_ = 0;
    bottom_blob_int8.elempack = 0;
    bottom_blob_int8.data = (void *)0x0;
    bottom_blob_int8.refcount._0_4_ = 0;
    bottom_blob_int8.refcount._4_4_ = 0;
    bottom_blob_int8.allocator = (Allocator *)0x0;
    bottom_blob_int8.dims = 0;
    bottom_blob_int8.w = 0;
    bottom_blob_int8.h = 0;
    bottom_blob_int8.c = 0;
    bottom_blob_int8.cstep = 0;
    Mat::create(&bottom_blob_int8,iVar56,iVar59,iVar9,1,opt->workspace_allocator);
    if ((bottom_blob_int8.data == (void *)0x0) ||
       ((long)bottom_blob_int8.c * bottom_blob_int8.cstep == 0)) {
      Mat::~Mat(&bottom_blob_int8);
      iVar56 = -100;
      goto LAB_00151883;
    }
    p_Var51 = this->_vptr_ConvolutionDepthWise_x86[-3];
    iVar68 = iVar9 / *(int *)(&this->field_0xb8 + (long)p_Var51);
    iVar66 = 0;
    for (lVar57 = 0; lVar57 < *(int *)(&this->field_0xb8 + (long)p_Var51); lVar57 = lVar57 + 1) {
      uVar7._0_1_ = opt->lightmode;
      uVar7._1_3_ = *(undefined3 *)&opt->field_0x1;
      uVar7._4_4_ = opt->num_threads;
      uVar8._0_1_ = opt->use_winograd_convolution;
      uVar8._1_1_ = opt->use_sgemm_convolution;
      uVar8._2_1_ = opt->use_int8_inference;
      uVar8._3_1_ = opt->use_vulkan_compute;
      uVar23 = opt->use_fp16_packed;
      uVar24 = opt->use_fp16_storage;
      uVar26 = opt->use_fp16_arithmetic;
      uVar28 = opt->use_int8_storage;
      uVar27 = CONCAT11(uVar28,uVar26);
      uVar25 = CONCAT21(uVar27,uVar24);
      uVar8._4_4_ = CONCAT31(uVar25,uVar23);
      opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_g.use_packing_layout = opt->use_packing_layout;
      opt_g._34_6_ = *(undefined6 *)&opt->field_0x22;
      opt_g.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
      opt_g.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      opt_g._24_4_ = SUB84(uVar8,0);
      opt_g._0_4_ = SUB84(uVar7,0);
      opt_g.num_threads = 1;
      opt_g.blob_allocator._0_4_ = SUB84(bottom_blob_int8.allocator,0);
      opt_g.blob_allocator._4_4_ = (undefined4)((ulong)bottom_blob_int8.allocator >> 0x20);
      opt_g._28_4_ = uVar8._4_4_;
      Mat::channel_range(&bottom_blob_g,bottom_blob,iVar66,iVar68);
      Mat::channel_range(&bottom_blob_int8_g,&bottom_blob_int8,iVar66,iVar68);
      plVar12 = *(long **)(*(long *)(&this->field_0x210 +
                                    (long)this->_vptr_ConvolutionDepthWise_x86[-3]) + lVar57 * 8);
      (**(code **)(*plVar12 + 0x38))(plVar12,&bottom_blob_g,&bottom_blob_int8_g,&opt_g);
      Mat::~Mat(&bottom_blob_int8_g);
      Mat::~Mat(&bottom_blob_g);
      p_Var51 = this->_vptr_ConvolutionDepthWise_x86[-3];
      iVar66 = iVar66 + iVar68;
    }
    Mat::operator=(&bottom_blob_unbordered,&bottom_blob_int8);
    Mat::~Mat(&bottom_blob_int8);
  }
  bottom_blob_int8_g.data = bottom_blob_unbordered.data;
  bottom_blob_int8_g.refcount = bottom_blob_unbordered.refcount;
  bottom_blob_int8_g.elemsize = bottom_blob_unbordered.elemsize;
  bottom_blob_int8_g.elempack = bottom_blob_unbordered.elempack;
  bottom_blob_int8_g.allocator = bottom_blob_unbordered.allocator;
  bottom_blob_int8_g.dims = bottom_blob_unbordered.dims;
  bottom_blob_int8_g.w = bottom_blob_unbordered.w;
  bottom_blob_int8_g.h = bottom_blob_unbordered.h;
  bottom_blob_int8_g.c = bottom_blob_unbordered.c;
  bottom_blob_int8_g.cstep = bottom_blob_unbordered.cstep;
  if (bottom_blob_unbordered.refcount != (int *)0x0) {
    LOCK();
    *bottom_blob_unbordered.refcount = *bottom_blob_unbordered.refcount + 1;
    UNLOCK();
  }
  pp_Var13 = this->_vptr_ConvolutionDepthWise_x86;
  p_Var51 = pp_Var13[-3];
  iVar66 = *(int *)(&this->field_0x9c + (long)p_Var51);
  if ((((iVar66 < 1) && (iVar68 = *(int *)(&this->field_0xa0 + (long)p_Var51), iVar68 < 1)) &&
      (iVar10 = *(int *)(&this->field_0xa4 + (long)p_Var51), iVar10 < 1)) &&
     (iVar11 = *(int *)(&this->field_0xa8 + (long)p_Var51), iVar11 < 1)) {
    if (((iVar66 == -0xe9) && (iVar68 == -0xe9)) && ((iVar10 == -0xe9 && (iVar11 == -0xe9)))) {
      iVar66 = uVar55 - (iVar56 + -1) % *(int *)(&this->field_0x94 + (long)p_Var51);
      iVar56 = uVar58 - (iVar59 + -1) % *(int *)(&this->field_0x98 + (long)p_Var51);
      if ((0 < iVar66) || (0 < iVar56)) {
        bottom_blob_int8.allocator = *(Allocator **)&opt->use_int8_arithmetic;
        bottom_blob_int8.data = *(void **)opt;
        uVar36._0_1_ = opt->use_winograd_convolution;
        uVar36._1_1_ = opt->use_sgemm_convolution;
        uVar36._2_1_ = opt->use_int8_inference;
        uVar36._3_1_ = opt->use_vulkan_compute;
        uVar37 = opt->use_fp16_packed;
        uVar38 = opt->use_fp16_storage;
        uVar40 = opt->use_fp16_arithmetic;
        uVar42 = opt->use_int8_storage;
        uVar41 = CONCAT11(uVar42,uVar40);
        uVar39 = CONCAT21(uVar41,uVar38);
        uVar36._4_4_ = CONCAT31(uVar39,uVar37);
        bottom_blob_int8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
        bottom_blob_int8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        bottom_blob_int8.elempack = (int)uVar36;
        bottom_blob_int8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
        bottom_blob_int8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        bottom_blob_int8._28_4_ = uVar36._4_4_;
        copy_make_border(&bottom_blob_unbordered,&bottom_blob_int8_g,iVar56 / 2,iVar56 - iVar56 / 2,
                         iVar66 / 2,iVar66 - iVar66 / 2,0,
                         *(float *)(&this->field_0xac + (long)pp_Var13[-3]),
                         (Option *)&bottom_blob_int8);
        goto LAB_001513aa;
      }
LAB_001513d0:
      iVar56 = bottom_blob_int8_g.w;
      iVar59 = bottom_blob_int8_g.h;
    }
    else if (((iVar66 == -0xea) && (iVar68 == -0xea)) && ((iVar10 == -0xea && (iVar11 == -0xea)))) {
      iVar66 = uVar55 - (iVar56 + -1) % *(int *)(&this->field_0x94 + (long)p_Var51);
      iVar56 = uVar58 - (iVar59 + -1) % *(int *)(&this->field_0x98 + (long)p_Var51);
      if ((0 < iVar66) || (0 < iVar56)) {
        bottom_blob_int8.allocator = *(Allocator **)&opt->use_int8_arithmetic;
        bottom_blob_int8.data = *(void **)opt;
        uVar43._0_1_ = opt->use_winograd_convolution;
        uVar43._1_1_ = opt->use_sgemm_convolution;
        uVar43._2_1_ = opt->use_int8_inference;
        uVar43._3_1_ = opt->use_vulkan_compute;
        uVar44 = opt->use_fp16_packed;
        uVar45 = opt->use_fp16_storage;
        uVar47 = opt->use_fp16_arithmetic;
        uVar49 = opt->use_int8_storage;
        uVar48 = CONCAT11(uVar49,uVar47);
        uVar46 = CONCAT21(uVar48,uVar45);
        uVar43._4_4_ = CONCAT31(uVar46,uVar44);
        bottom_blob_int8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
        bottom_blob_int8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        bottom_blob_int8.elempack = (int)uVar43;
        bottom_blob_int8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
        bottom_blob_int8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        bottom_blob_int8._28_4_ = uVar43._4_4_;
        copy_make_border(&bottom_blob_unbordered,&bottom_blob_int8_g,iVar56 - iVar56 / 2,iVar56 / 2,
                         iVar66 - iVar66 / 2,iVar66 / 2,0,
                         *(float *)(&this->field_0xac + (long)pp_Var13[-3]),
                         (Option *)&bottom_blob_int8);
        goto LAB_001513aa;
      }
      goto LAB_001513d0;
    }
    p_Var51 = this->_vptr_ConvolutionDepthWise_x86[-3];
    iVar56 = (int)(~uVar55 + iVar56) / *(int *)(&this->field_0x94 + (long)p_Var51) + 1;
    iVar59 = (int)(~uVar58 + iVar59) / *(int *)(&this->field_0x98 + (long)p_Var51) + 1;
    if ((&this->field_0x20c)[(long)p_Var51] == '\x01') {
      if ((&this->field_0x20d)[(long)p_Var51] == '\x01') {
        opt_g.workspace_allocator._0_4_ = 0;
        opt_g.workspace_allocator._4_4_ = 0;
        opt_g.use_winograd_convolution = false;
        opt_g.use_sgemm_convolution = false;
        opt_g.use_int8_inference = false;
        opt_g.use_vulkan_compute = false;
        opt_g.lightmode = false;
        opt_g._1_3_ = 0;
        opt_g.num_threads = 0;
        opt_g.blob_allocator._0_4_ = 0;
        opt_g.blob_allocator._4_4_ = 0;
        opt_g.use_int8_arithmetic = false;
        opt_g.use_packing_layout = false;
        opt_g._34_6_ = 0;
        Mat::create((Mat *)&opt_g,iVar56,iVar59,
                    *(int *)(&this->field_0x80 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]),4,
                    opt->workspace_allocator);
        iVar56 = -100;
        Mat::~Mat((Mat *)&opt_g);
      }
      else {
        Mat::create(top_blob,iVar56,iVar59,*(int *)(&this->field_0x80 + (long)p_Var51),4,
                    opt->blob_allocator);
        iVar56 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          p_Var51 = this->_vptr_ConvolutionDepthWise_x86[-3];
          iVar56 = *(int *)(&this->field_0xb8 + (long)p_Var51);
          if (iVar9 == *(int *)(&this->field_0x80 + (long)p_Var51) && iVar9 == iVar56) {
            if ((((*(int *)(&this->field_0x84 + (long)p_Var51) == 3) &&
                 (*(int *)(&this->field_0x88 + (long)p_Var51) == 3)) &&
                (*(int *)(&this->field_0x8c + (long)p_Var51) == 1)) &&
               (*(int *)(&this->field_0x90 + (long)p_Var51) == 1)) {
              if (*(int *)(&this->field_0x94 + (long)p_Var51) == 2) {
                if (*(int *)(&this->field_0x98 + (long)p_Var51) != 2) goto LAB_00152b90;
                local_1c0 = &local_90;
                std::vector<float,_std::allocator<float>_>::vector
                          ((vector<float,_std::allocator<float>_> *)local_1c0,
                           (vector<float,_std::allocator<float>_> *)
                           (&this->field_0x258 + (long)p_Var51));
                lVar52 = (long)bottom_blob_int8_g.w;
                iVar9 = top_blob->w;
                lVar57 = *(long *)(&this->field_0x108 + (long)p_Var51);
                lVar14 = *(long *)(&this->field_0x148 + (long)p_Var51);
                lVar67 = (long)((bottom_blob_int8_g.w - iVar9) * 2);
                uVar72 = 0;
                iVar56 = top_blob->h;
                if (top_blob->h < 1) {
                  iVar56 = 0;
                }
                uVar70 = (ulong)(uint)top_blob->c;
                if (top_blob->c < 1) {
                  uVar70 = uVar72;
                }
                for (; uVar72 != uVar70; uVar72 = uVar72 + 1) {
                  Mat::channel(&bottom_blob_int8,top_blob,(int)uVar72);
                  pfVar60 = (float *)bottom_blob_int8.data;
                  if (lVar14 == 0) {
                    fVar73 = 0.0;
                  }
                  else {
                    fVar73 = *(float *)(lVar14 + uVar72 * 4);
                  }
                  fVar6 = local_90._M_impl.super__Vector_impl_data._M_start[uVar72];
                  Mat::fill(&bottom_blob_int8,fVar73);
                  lVar50 = uVar72 * 9;
                  pvVar53 = (void *)((long)(int)uVar72 * bottom_blob_int8_g.cstep *
                                     bottom_blob_int8_g.elemsize + (long)bottom_blob_int8_g.data);
                  bottom_blob_g.refcount = (int *)0x0;
                  bottom_blob_g.elemsize = bottom_blob_int8_g.elemsize;
                  bottom_blob_g.elempack = bottom_blob_int8_g.elempack;
                  bottom_blob_g.allocator = bottom_blob_int8_g.allocator;
                  bottom_blob_g.dims = 2;
                  bottom_blob_g.w = bottom_blob_int8_g.w;
                  bottom_blob_g.h = bottom_blob_int8_g.h;
                  bottom_blob_g.c = 1;
                  bottom_blob_g.cstep = (size_t)(bottom_blob_int8_g.h * bottom_blob_int8_g.w);
                  bottom_blob_g.data = pvVar53;
                  Mat::~Mat(&bottom_blob_g);
                  lVar64 = lVar52 + (long)pvVar53;
                  pvVar54 = (void *)(lVar52 * 2 + (long)pvVar53);
                  for (iVar59 = 0; iVar59 != iVar56; iVar59 = iVar59 + 1) {
                    lVar63 = 0;
                    for (iVar66 = iVar9; 0 < iVar66; iVar66 = iVar66 + -1) {
                      *pfVar60 = (float)((int)*(char *)(lVar57 + 8 + lVar50) *
                                         (int)*(char *)((long)pvVar54 + lVar63 + 2) +
                                         (int)*(char *)(lVar57 + 7 + lVar50) *
                                         (int)*(char *)((long)pvVar54 + lVar63 + 1) +
                                        (int)*(char *)(lVar57 + 6 + lVar50) *
                                        (int)*(char *)((long)pvVar54 + lVar63) +
                                        (int)*(char *)(lVar57 + 5 + lVar50) *
                                        (int)*(char *)(lVar64 + 2 + lVar63) +
                                        (int)*(char *)(lVar57 + 4 + lVar50) *
                                        (int)*(char *)(lVar64 + 1 + lVar63) +
                                        (int)*(char *)(lVar57 + 3 + lVar50) *
                                        (int)*(char *)(lVar64 + lVar63) +
                                        (int)*(char *)(lVar57 + 2 + lVar50) *
                                        (int)*(char *)((long)pvVar53 + lVar63 + 2) +
                                        (int)*(char *)(lVar57 + 1 + lVar50) *
                                        (int)*(char *)((long)pvVar53 + lVar63 + 1) +
                                        (int)*(char *)(lVar57 + lVar50) *
                                        (int)*(char *)((long)pvVar53 + lVar63)) * fVar6 + *pfVar60;
                      pfVar60 = pfVar60 + 1;
                      lVar63 = lVar63 + 2;
                    }
                    pvVar53 = (void *)((long)pvVar53 + lVar63 + lVar67);
                    lVar64 = lVar64 + lVar67 + lVar63;
                    pvVar54 = (void *)((long)pvVar54 + lVar63 + lVar67);
                  }
                  Mat::~Mat(&bottom_blob_int8);
                }
              }
              else {
                if ((*(int *)(&this->field_0x94 + (long)p_Var51) != 1) ||
                   (*(int *)(&this->field_0x98 + (long)p_Var51) != 1)) goto LAB_00152b90;
                local_1c0 = local_78;
                std::vector<float,_std::allocator<float>_>::vector
                          ((vector<float,_std::allocator<float>_> *)local_1c0,
                           (vector<float,_std::allocator<float>_> *)
                           (&this->field_0x258 + (long)p_Var51));
                lVar52 = (long)bottom_blob_int8_g.w;
                iVar9 = top_blob->w;
                lVar57 = *(long *)(&this->field_0x108 + (long)p_Var51);
                lVar14 = *(long *)(&this->field_0x148 + (long)p_Var51);
                uVar72 = 0;
                iVar56 = top_blob->h;
                if (top_blob->h < 1) {
                  iVar56 = 0;
                }
                uVar70 = (ulong)(uint)top_blob->c;
                if (top_blob->c < 1) {
                  uVar70 = uVar72;
                }
                for (; uVar72 != uVar70; uVar72 = uVar72 + 1) {
                  Mat::channel(&bottom_blob_int8,top_blob,(int)uVar72);
                  pvVar54 = bottom_blob_int8.data;
                  if (lVar14 == 0) {
                    fVar73 = 0.0;
                  }
                  else {
                    fVar73 = *(float *)(lVar14 + uVar72 * 4);
                  }
                  fVar6 = local_78[0]._M_impl.super__Vector_impl_data._M_start[uVar72];
                  Mat::fill(&bottom_blob_int8,fVar73);
                  lVar67 = uVar72 * 9;
                  pvVar71 = (void *)((long)(int)uVar72 * bottom_blob_int8_g.cstep *
                                     bottom_blob_int8_g.elemsize + (long)bottom_blob_int8_g.data);
                  bottom_blob_g.refcount = (int *)0x0;
                  bottom_blob_g.elemsize = bottom_blob_int8_g.elemsize;
                  bottom_blob_g.elempack = bottom_blob_int8_g.elempack;
                  bottom_blob_g.allocator = bottom_blob_int8_g.allocator;
                  bottom_blob_g.dims = 2;
                  bottom_blob_g.w = bottom_blob_int8_g.w;
                  bottom_blob_g.h = bottom_blob_int8_g.h;
                  bottom_blob_g.c = 1;
                  bottom_blob_g.cstep = (size_t)(bottom_blob_int8_g.h * bottom_blob_int8_g.w);
                  bottom_blob_g.data = pvVar71;
                  Mat::~Mat(&bottom_blob_g);
                  lVar50 = lVar52 + (long)pvVar71;
                  pvVar53 = (void *)(lVar52 * 2 + (long)pvVar71);
                  for (iVar59 = 0; iVar59 != iVar56; iVar59 = iVar59 + 1) {
                    lVar64 = 0;
                    pvVar62 = pvVar54;
                    for (iVar66 = iVar9; 0 < iVar66; iVar66 = iVar66 + -1) {
                      *(float *)((long)pvVar54 + lVar64 * 4) =
                           (float)((int)*(char *)(lVar57 + 8 + lVar67) *
                                   (int)*(char *)((long)pvVar53 + lVar64 + 2) +
                                   (int)*(char *)(lVar57 + 7 + lVar67) *
                                   (int)*(char *)((long)pvVar53 + lVar64 + 1) +
                                  (int)*(char *)(lVar57 + 6 + lVar67) *
                                  (int)*(char *)((long)pvVar53 + lVar64) +
                                  (int)*(char *)(lVar57 + 5 + lVar67) *
                                  (int)*(char *)(lVar50 + 2 + lVar64) +
                                  (int)*(char *)(lVar57 + 4 + lVar67) *
                                  (int)*(char *)(lVar50 + 1 + lVar64) +
                                  (int)*(char *)(lVar57 + 3 + lVar67) *
                                  (int)*(char *)(lVar50 + lVar64) +
                                  (int)*(char *)(lVar57 + 2 + lVar67) *
                                  (int)*(char *)((long)pvVar71 + lVar64 + 2) +
                                  (int)*(char *)(lVar57 + 1 + lVar67) *
                                  (int)*(char *)((long)pvVar71 + lVar64 + 1) +
                                  (int)*(char *)(lVar57 + lVar67) *
                                  (int)*(char *)((long)pvVar71 + lVar64)) * fVar6 +
                           *(float *)((long)pvVar54 + lVar64 * 4);
                      pvVar62 = (void *)((long)pvVar62 + 4);
                      lVar64 = lVar64 + 1;
                    }
                    pvVar71 = (void *)((long)pvVar71 + lVar64 + 2);
                    lVar50 = lVar50 + lVar64 + 2;
                    pvVar53 = (void *)((long)pvVar53 + lVar64 + 2);
                    pvVar54 = pvVar62;
                  }
                  Mat::~Mat(&bottom_blob_int8);
                }
              }
              std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(local_1c0);
            }
            else {
LAB_00152b90:
              for (lVar57 = 0; lVar57 < *(int *)(&this->field_0xb8 + (long)p_Var51);
                  lVar57 = lVar57 + 1) {
                Mat::channel_range(&bottom_blob_int8,&bottom_blob_int8_g,(int)lVar57,1);
                Mat::channel_range(&bottom_blob_g,top_blob,(int)lVar57,1);
                pLVar65 = (this->group_ops).
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar57];
                opt_g.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
                opt_g.workspace_allocator._4_4_ =
                     *(undefined4 *)((long)&opt->workspace_allocator + 4);
                opt_g.use_winograd_convolution = opt->use_winograd_convolution;
                opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
                opt_g.use_int8_inference = opt->use_int8_inference;
                opt_g.use_vulkan_compute = opt->use_vulkan_compute;
                opt_g.use_fp16_packed = opt->use_fp16_packed;
                opt_g.use_fp16_storage = opt->use_fp16_storage;
                opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
                opt_g.use_int8_storage = opt->use_int8_storage;
                opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
                opt_g.use_packing_layout = opt->use_packing_layout;
                opt_g._34_6_ = *(undefined6 *)&opt->field_0x22;
                opt_g.num_threads = 1;
                opt_g.lightmode = opt->lightmode;
                opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
                opt_g.blob_allocator._0_4_ = SUB84(top_blob->allocator,0);
                opt_g.blob_allocator._4_4_ = (undefined4)((ulong)top_blob->allocator >> 0x20);
                (*pLVar65->_vptr_Layer[7])(pLVar65,&bottom_blob_int8,&bottom_blob_g,&opt_g);
                Mat::~Mat(&bottom_blob_g);
                Mat::~Mat(&bottom_blob_int8);
                p_Var51 = this->_vptr_ConvolutionDepthWise_x86[-3];
              }
            }
          }
          else {
            iVar59 = *(int *)(&this->field_0x80 + (long)p_Var51) / iVar56;
            iVar66 = 0;
            local_288 = 0;
            for (lVar57 = 0; lVar57 < *(int *)(&this->field_0xb8 + (long)p_Var51);
                lVar57 = lVar57 + 1) {
              Mat::channel_range(&bottom_blob_int8,&bottom_blob_int8_g,iVar66,iVar9 / iVar56);
              Mat::channel_range(&bottom_blob_g,top_blob,local_288,iVar59);
              pLVar65 = (this->group_ops).
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar57];
              opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
              opt_g.use_packing_layout = opt->use_packing_layout;
              opt_g._34_6_ = *(undefined6 *)&opt->field_0x22;
              opt_g.lightmode = opt->lightmode;
              opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
              opt_g.num_threads = opt->num_threads;
              opt_g.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
              opt_g.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4)
              ;
              opt_g.use_winograd_convolution = opt->use_winograd_convolution;
              opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
              opt_g.use_int8_inference = opt->use_int8_inference;
              opt_g.use_vulkan_compute = opt->use_vulkan_compute;
              opt_g.use_fp16_packed = opt->use_fp16_packed;
              opt_g.use_fp16_storage = opt->use_fp16_storage;
              opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
              opt_g.use_int8_storage = opt->use_int8_storage;
              opt_g.blob_allocator._0_4_ = SUB84(top_blob->allocator,0);
              opt_g.blob_allocator._4_4_ = (undefined4)((ulong)top_blob->allocator >> 0x20);
              (*pLVar65->_vptr_Layer[7])(pLVar65,&bottom_blob_int8,&bottom_blob_g,&opt_g);
              Mat::~Mat(&bottom_blob_g);
              Mat::~Mat(&bottom_blob_int8);
              p_Var51 = this->_vptr_ConvolutionDepthWise_x86[-3];
              local_288 = local_288 + iVar59;
              iVar66 = iVar66 + iVar9 / iVar56;
            }
          }
LAB_001520ad:
          pLVar65 = this->activation;
LAB_001520b6:
          if (pLVar65 != (Layer *)0x0) {
            (*pLVar65->_vptr_Layer[9])(pLVar65,top_blob,opt);
          }
          iVar56 = 0;
        }
      }
    }
    else {
      Mat::create(top_blob,iVar56,iVar59,*(int *)(&this->field_0x80 + (long)p_Var51),_elemsize,
                  opt->blob_allocator);
      iVar56 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        p_Var51 = this->_vptr_ConvolutionDepthWise_x86[-3];
        iVar56 = *(int *)(&this->field_0xb8 + (long)p_Var51);
        if (iVar9 == *(int *)(&this->field_0x80 + (long)p_Var51) && iVar9 == iVar56) {
          if ((((*(int *)(&this->field_0x84 + (long)p_Var51) != 3) ||
               (*(int *)(&this->field_0x88 + (long)p_Var51) != 3)) ||
              (*(int *)(&this->field_0x8c + (long)p_Var51) != 1)) ||
             (*(int *)(&this->field_0x90 + (long)p_Var51) != 1)) {
            for (lVar57 = 0; lVar57 < *(int *)(&this->field_0xb8 + (long)p_Var51);
                lVar57 = lVar57 + 1) {
              Mat::channel_range(&bottom_blob_int8,&bottom_blob_int8_g,(int)lVar57,1);
              Mat::channel_range(&bottom_blob_g,top_blob,(int)lVar57,1);
              pLVar65 = (this->group_ops).
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar57];
              opt_g.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
              opt_g.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4)
              ;
              opt_g.use_winograd_convolution = opt->use_winograd_convolution;
              opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
              opt_g.use_int8_inference = opt->use_int8_inference;
              opt_g.use_vulkan_compute = opt->use_vulkan_compute;
              opt_g.use_fp16_packed = opt->use_fp16_packed;
              opt_g.use_fp16_storage = opt->use_fp16_storage;
              opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
              opt_g.use_int8_storage = opt->use_int8_storage;
              opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
              opt_g.use_packing_layout = opt->use_packing_layout;
              opt_g._34_6_ = *(undefined6 *)&opt->field_0x22;
              opt_g.num_threads = 1;
              opt_g.lightmode = opt->lightmode;
              opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
              opt_g.blob_allocator._0_4_ = SUB84(top_blob->allocator,0);
              opt_g.blob_allocator._4_4_ = (undefined4)((ulong)top_blob->allocator >> 0x20);
              (*pLVar65->_vptr_Layer[7])(pLVar65,&bottom_blob_int8,&bottom_blob_g,&opt_g);
              Mat::~Mat(&bottom_blob_g);
              Mat::~Mat(&bottom_blob_int8);
              p_Var51 = this->_vptr_ConvolutionDepthWise_x86[-3];
            }
            goto LAB_001520ad;
          }
          if (*(int *)(&this->field_0x94 + (long)p_Var51) == 2) {
            if (*(int *)(&this->field_0x98 + (long)p_Var51) == 2) {
              lVar52 = (long)bottom_blob_int8_g.w;
              iVar9 = top_blob->w;
              lVar57 = *(long *)(&this->field_0x108 + (long)p_Var51);
              lVar14 = *(long *)(&this->field_0x148 + (long)p_Var51);
              uVar72 = 0;
              iVar56 = top_blob->h;
              if (top_blob->h < 1) {
                iVar56 = 0;
              }
              uVar70 = (ulong)(uint)bottom_blob_int8_g.c;
              if (bottom_blob_int8_g.c < 1) {
                uVar70 = uVar72;
              }
              lVar67 = (long)((bottom_blob_int8_g.w - iVar9) * 2) * 4;
              for (; uVar72 != uVar70; uVar72 = uVar72 + 1) {
                Mat::channel(&bottom_blob_int8,top_blob,(int)uVar72);
                pfVar60 = (float *)bottom_blob_int8.data;
                if (lVar14 == 0) {
                  fVar73 = 0.0;
                }
                else {
                  fVar73 = *(float *)(lVar14 + uVar72 * 4);
                }
                lVar50 = uVar72 * 0x24;
                pvVar71 = (void *)((long)(int)uVar72 * bottom_blob_int8_g.cstep *
                                   bottom_blob_int8_g.elemsize + (long)bottom_blob_int8_g.data);
                bottom_blob_g.refcount = (int *)0x0;
                bottom_blob_g.elemsize = bottom_blob_int8_g.elemsize;
                bottom_blob_g.elempack = bottom_blob_int8_g.elempack;
                bottom_blob_g.allocator = bottom_blob_int8_g.allocator;
                bottom_blob_g.dims = 2;
                bottom_blob_g.w = bottom_blob_int8_g.w;
                bottom_blob_g.h = bottom_blob_int8_g.h;
                bottom_blob_g.c = 1;
                bottom_blob_g.cstep = (size_t)(bottom_blob_int8_g.h * bottom_blob_int8_g.w);
                bottom_blob_g.data = pvVar71;
                Mat::~Mat(&bottom_blob_g);
                pvVar54 = (void *)(lVar52 * 4 + (long)pvVar71);
                pvVar53 = (void *)(lVar52 * 8 + (long)pvVar71);
                for (iVar59 = 0; iVar59 != iVar56; iVar59 = iVar59 + 1) {
                  lVar64 = 0;
                  for (iVar66 = iVar9; 0 < iVar66; iVar66 = iVar66 + -1) {
                    uVar7 = *(undefined8 *)((long)pvVar71 + lVar64 + 4);
                    pfVar1 = (float *)(lVar57 + lVar50);
                    pfVar2 = (float *)(lVar57 + 0x10 + lVar50);
                    uVar8 = *(undefined8 *)((long)pvVar54 + lVar64 + 4);
                    *pfVar60 = (float)((ulong)*(undefined8 *)((long)pvVar53 + lVar64) >> 0x20) *
                               pfVar2[3] + *(float *)((long)pvVar54 + lVar64) * pfVar1[3] +
                               (float)((ulong)uVar8 >> 0x20) * pfVar2[1] + (float)uVar7 * pfVar1[1]
                               + (float)*(undefined8 *)((long)pvVar53 + lVar64) * pfVar2[2] +
                                 (float)((ulong)uVar7 >> 0x20) * pfVar1[2] +
                                 (float)uVar8 * *pfVar2 +
                                 *(float *)((long)pvVar71 + lVar64) * *pfVar1 +
                               *(float *)(lVar57 + 0x20 + lVar50) *
                               *(float *)((long)pvVar53 + lVar64 + 8) + fVar73;
                    pfVar60 = pfVar60 + 1;
                    lVar64 = lVar64 + 8;
                  }
                  pvVar71 = (void *)((long)pvVar71 + lVar64 + lVar67);
                  pvVar54 = (void *)((long)pvVar54 + lVar64 + lVar67);
                  pvVar53 = (void *)((long)pvVar53 + lVar64 + lVar67);
                }
                Mat::~Mat(&bottom_blob_int8);
              }
            }
          }
          else if ((*(int *)(&this->field_0x94 + (long)p_Var51) == 1) &&
                  (*(int *)(&this->field_0x98 + (long)p_Var51) == 1)) {
            lVar52 = (long)bottom_blob_int8_g.w;
            iVar9 = top_blob->w;
            iVar56 = top_blob->h;
            lVar57 = *(long *)(&this->field_0x108 + (long)p_Var51);
            lVar14 = *(long *)(&this->field_0x148 + (long)p_Var51);
            lVar67 = (long)iVar9;
            uVar70 = 0;
            uVar72 = (ulong)(uint)bottom_blob_int8_g.c;
            if (bottom_blob_int8_g.c < 1) {
              uVar72 = uVar70;
            }
            lVar50 = (long)(bottom_blob_int8_g.w + 2) * 4;
            for (; uVar70 != uVar72; uVar70 = uVar70 + 1) {
              Mat::channel(&bottom_blob_int8,top_blob,(int)uVar70);
              pvVar54 = bottom_blob_int8.data;
              if (lVar14 == 0) {
                fVar73 = 0.0;
              }
              else {
                fVar73 = *(float *)(lVar14 + uVar70 * 4);
              }
              lVar64 = uVar70 * 0x24;
              pvVar69 = (void *)((long)(int)uVar70 * bottom_blob_int8_g.cstep *
                                 bottom_blob_int8_g.elemsize + (long)bottom_blob_int8_g.data);
              bottom_blob_g.refcount = (int *)0x0;
              bottom_blob_g.elemsize = bottom_blob_int8_g.elemsize;
              bottom_blob_g.elempack = bottom_blob_int8_g.elempack;
              bottom_blob_g.allocator = bottom_blob_int8_g.allocator;
              bottom_blob_g.dims = 2;
              bottom_blob_g.w = bottom_blob_int8_g.w;
              bottom_blob_g.h = bottom_blob_int8_g.h;
              bottom_blob_g.c = 1;
              bottom_blob_g.cstep = (size_t)(bottom_blob_int8_g.h * bottom_blob_int8_g.w);
              bottom_blob_g.data = pvVar69;
              Mat::~Mat(&bottom_blob_g);
              pvVar53 = (void *)((long)pvVar69 + lVar52 * 4);
              pvVar71 = (void *)((long)pvVar69 + lVar52 * 8);
              pvVar62 = (void *)((long)pvVar69 + lVar52 * 0xc);
              pvVar61 = pvVar54;
              for (uVar55 = 0; (int)(uVar55 | 1) < iVar56; uVar55 = uVar55 + 2) {
                lVar63 = 0;
                for (iVar59 = iVar9; 0 < iVar59; iVar59 = iVar59 + -1) {
                  uVar7 = *(undefined8 *)((long)pvVar69 + lVar63 + 4);
                  uVar8 = *(undefined8 *)((long)pvVar53 + lVar63 + 4);
                  pfVar60 = (float *)(lVar57 + lVar64);
                  fVar15 = *pfVar60;
                  fVar16 = pfVar60[1];
                  fVar17 = pfVar60[2];
                  fVar18 = pfVar60[3];
                  pfVar60 = (float *)(lVar57 + 0x10 + lVar64);
                  fVar19 = *pfVar60;
                  fVar20 = pfVar60[1];
                  fVar21 = pfVar60[2];
                  fVar22 = pfVar60[3];
                  fVar6 = *(float *)((long)pvVar53 + lVar63);
                  fVar74 = (float)uVar8;
                  fVar75 = (float)((ulong)uVar8 >> 0x20);
                  fVar76 = (float)*(undefined8 *)((long)pvVar71 + lVar63);
                  fVar77 = (float)((ulong)*(undefined8 *)((long)pvVar71 + lVar63) >> 0x20);
                  fVar3 = *(float *)((long)pvVar71 + lVar63 + 8);
                  fVar4 = *(float *)(lVar57 + 0x20 + lVar64);
                  uVar8 = *(undefined8 *)((long)pvVar62 + lVar63);
                  fVar5 = *(float *)((long)pvVar62 + lVar63 + 8);
                  *(float *)((long)pvVar61 + lVar63) =
                       fVar4 * fVar3 + fVar73 +
                       fVar77 * fVar22 + fVar6 * fVar18 + fVar75 * fVar20 + (float)uVar7 * fVar16 +
                       fVar76 * fVar21 + (float)((ulong)uVar7 >> 0x20) * fVar17 +
                       fVar74 * fVar19 + *(float *)((long)pvVar69 + lVar63) * fVar15;
                  *(float *)((long)pvVar54 + lVar63 + lVar67 * 4) =
                       fVar4 * fVar5 + fVar73 +
                       (float)((ulong)uVar8 >> 0x20) * fVar22 + fVar18 * fVar76 +
                       fVar3 * fVar20 + fVar16 * fVar74 +
                       (float)uVar8 * fVar21 + fVar17 * fVar75 + fVar77 * fVar19 + fVar6 * fVar15;
                  lVar63 = lVar63 + 4;
                }
                pvVar69 = (void *)((long)pvVar69 + lVar63 + lVar50);
                pvVar53 = (void *)((long)pvVar53 + lVar63 + lVar50);
                pvVar71 = (void *)((long)pvVar71 + lVar63 + lVar50);
                pvVar62 = (void *)((long)pvVar62 + lVar63 + lVar50);
                pvVar61 = (void *)((long)pvVar61 + lVar63 + lVar67 * 4);
                pvVar54 = (void *)((long)pvVar54 + lVar63 + lVar67 * 4);
              }
              for (; (int)uVar55 < iVar56; uVar55 = uVar55 + 1) {
                lVar63 = 0;
                for (iVar59 = iVar9; 0 < iVar59; iVar59 = iVar59 + -1) {
                  uVar7 = *(undefined8 *)((long)pvVar69 + lVar63 + 4);
                  pfVar60 = (float *)(lVar57 + lVar64);
                  pfVar1 = (float *)(lVar57 + 0x10 + lVar64);
                  uVar8 = *(undefined8 *)((long)pvVar53 + lVar63 + 4);
                  *(float *)((long)pvVar61 + lVar63) =
                       *(float *)(lVar57 + 0x20 + lVar64) * *(float *)((long)pvVar71 + lVar63 + 8) +
                       fVar73 + (float)((ulong)*(undefined8 *)((long)pvVar71 + lVar63) >> 0x20) *
                                pfVar1[3] + *(float *)((long)pvVar53 + lVar63) * pfVar60[3] +
                                (float)((ulong)uVar8 >> 0x20) * pfVar1[1] +
                                (float)uVar7 * pfVar60[1] +
                                (float)*(undefined8 *)((long)pvVar71 + lVar63) * pfVar1[2] +
                                (float)((ulong)uVar7 >> 0x20) * pfVar60[2] +
                                (float)uVar8 * *pfVar1 +
                                *(float *)((long)pvVar69 + lVar63) * *pfVar60;
                  lVar63 = lVar63 + 4;
                }
                pvVar69 = (void *)((long)pvVar69 + lVar63 + 8);
                pvVar53 = (void *)((long)pvVar53 + lVar63 + 8);
                pvVar71 = (void *)((long)pvVar71 + lVar63 + 8);
                pvVar61 = (void *)((long)pvVar61 + lVar63);
              }
              Mat::~Mat(&bottom_blob_int8);
            }
          }
          pLVar65 = this->activation;
          goto LAB_001520b6;
        }
        iVar59 = *(int *)(&this->field_0x80 + (long)p_Var51) / iVar56;
        iVar66 = 0;
        local_288 = 0;
        for (lVar57 = 0; lVar57 < *(int *)(&this->field_0xb8 + (long)p_Var51); lVar57 = lVar57 + 1)
        {
          Mat::channel_range(&bottom_blob_int8,&bottom_blob_int8_g,iVar66,iVar9 / iVar56);
          Mat::channel_range(&bottom_blob_g,top_blob,local_288,iVar59);
          pLVar65 = (this->group_ops).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar57];
          opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
          opt_g.use_packing_layout = opt->use_packing_layout;
          opt_g._34_6_ = *(undefined6 *)&opt->field_0x22;
          opt_g.lightmode = opt->lightmode;
          opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
          opt_g.num_threads = opt->num_threads;
          opt_g.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
          opt_g.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
          opt_g.use_winograd_convolution = opt->use_winograd_convolution;
          opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
          opt_g.use_int8_inference = opt->use_int8_inference;
          opt_g.use_vulkan_compute = opt->use_vulkan_compute;
          opt_g.use_fp16_packed = opt->use_fp16_packed;
          opt_g.use_fp16_storage = opt->use_fp16_storage;
          opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
          opt_g.use_int8_storage = opt->use_int8_storage;
          opt_g.blob_allocator._0_4_ = SUB84(top_blob->allocator,0);
          opt_g.blob_allocator._4_4_ = (undefined4)((ulong)top_blob->allocator >> 0x20);
          (*pLVar65->_vptr_Layer[7])(pLVar65,&bottom_blob_int8,&bottom_blob_g,&opt_g);
          Mat::~Mat(&bottom_blob_g);
          Mat::~Mat(&bottom_blob_int8);
          p_Var51 = this->_vptr_ConvolutionDepthWise_x86[-3];
          local_288 = local_288 + iVar59;
          iVar66 = iVar66 + iVar9 / iVar56;
        }
        pLVar65 = this->activation;
        iVar56 = 0;
        if (pLVar65 != (Layer *)0x0) {
          (*pLVar65->_vptr_Layer[9])(pLVar65,top_blob,opt);
        }
      }
    }
  }
  else {
    bottom_blob_int8.allocator = *(Allocator **)&opt->use_int8_arithmetic;
    bottom_blob_int8.data = *(void **)opt;
    uVar29._0_1_ = opt->use_winograd_convolution;
    uVar29._1_1_ = opt->use_sgemm_convolution;
    uVar29._2_1_ = opt->use_int8_inference;
    uVar29._3_1_ = opt->use_vulkan_compute;
    uVar30 = opt->use_fp16_packed;
    uVar31 = opt->use_fp16_storage;
    uVar33 = opt->use_fp16_arithmetic;
    uVar35 = opt->use_int8_storage;
    uVar34 = CONCAT11(uVar35,uVar33);
    uVar32 = CONCAT21(uVar34,uVar31);
    uVar29._4_4_ = CONCAT31(uVar32,uVar30);
    bottom_blob_int8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    bottom_blob_int8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    bottom_blob_int8.elempack = (int)uVar29;
    bottom_blob_int8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    bottom_blob_int8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    p_Var51 = pp_Var13[-3];
    bottom_blob_int8._28_4_ = uVar29._4_4_;
    copy_make_border(&bottom_blob_unbordered,&bottom_blob_int8_g,
                     *(int *)(&this->field_0xa4 + (long)p_Var51),
                     *(int *)(&this->field_0xa8 + (long)p_Var51),
                     *(int *)(&this->field_0x9c + (long)p_Var51),
                     *(int *)(&this->field_0xa0 + (long)p_Var51),0,
                     *(float *)(&this->field_0xac + (long)p_Var51),(Option *)&bottom_blob_int8);
LAB_001513aa:
    if ((bottom_blob_int8_g.data != (void *)0x0) &&
       ((long)bottom_blob_int8_g.c * bottom_blob_int8_g.cstep != 0)) goto LAB_001513d0;
    iVar56 = -100;
  }
  Mat::~Mat(&bottom_blob_int8_g);
LAB_00151883:
  Mat::~Mat(&bottom_blob_unbordered);
  return iVar56;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_int8.channel_range(channels_g * g, channels_g);
            quantize_ops[g]->forward(bottom_blob_g, bottom_blob_int8_g, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;       
    }     

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // int8
    if (use_int8_inference)
    {
        if (use_int8_requantize)
        {
            Mat top_blob_tm;
            top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
            if (top_blob_tm.empty())
                return -100;
            
            top_blob.create(outw, outh, num_output, (size_t)1u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            // depth-wise
            if (channels == group && group == num_output)
            {                
                if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
                {
                    if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
                    {
                        if (stride_w == 1 && stride_h == 1)
                        {
                            convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);                          
                        }
                        else if (stride_w == 2 && stride_h == 2)
                        {
                            convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);                           
                        }

                        if (activation)
                        {
                            activation->forward_inplace(top_blob, opt);
                        }

                        return 0;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g=0; g<group; g++)
                {
                    const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(g, 1);
                    Mat top_blob_tm_g = top_blob_tm.channel_range(g, 1);

                    const ncnn::Layer* op = group_ops[g];

                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    // forward
                    op->forward(bottom_blob_bordered_g, top_blob_tm_g, opt_g);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }                

                return 0;
            }

            const int channels_g = channels / group;
            const int num_output_g = num_output / group;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g=0; g<group; g++)
            {
                const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
                Mat top_blob_tm_g = top_blob_tm.channel_range(num_output_g * g, num_output_g);

                const ncnn::Layer* op = group_ops[g];

                Option opt_g = opt;
                opt_g.blob_allocator = top_blob.allocator;

                // forward
                op->forward(bottom_blob_bordered_g, top_blob_tm_g, opt_g);
            }                 
        }
        else
        {
            top_blob.create(outw, outh, num_output, (size_t)4u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            // depth-wise
            if (channels == group && group == num_output)
            {                
                if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
                {
                    if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
                    {
                        if (stride_w == 1 && stride_h == 1)
                        {
                            convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                        }
                        else if (stride_w == 2 && stride_h == 2)
                        {
                            convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);                          
                        }

                        if (activation)
                        {
                            activation->forward_inplace(top_blob, opt);
                        }                        

                        return 0;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g=0; g<group; g++)
                {
                    const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(g, 1);
                    Mat top_blob_g = top_blob.channel_range(g, 1);

                    const ncnn::Layer* op = group_ops[g];

                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    // forward
                    op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }                
              
                return 0;
            }

            const int channels_g = channels / group;
            const int num_output_g = num_output / group;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g=0; g<group; g++)
            {
                const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
                Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

                const ncnn::Layer* op = group_ops[g];

                Option opt_g = opt;
                opt_g.blob_allocator = top_blob.allocator;

                // forward
                op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
            }                       
        }

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }          

        return 0;
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;
    
    // depth-wise
    if (channels == group && group == num_output)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
        {
            if (stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
            }
            else if (stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
            }

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }

            return 0;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(g, 1);
            Mat top_blob_g = top_blob.channel_range(g, 1);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = top_blob.allocator;

         // forward
            op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        }

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }

        return 0;
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    for (int g=0; g<group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
        Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}